

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,StringPiece symbol)

{
  set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  byte bVar2;
  SymbolEntry *pSVar3;
  StringPiece super_symbol;
  StringPiece super_symbol_00;
  StringPiece sub_symbol;
  StringPiece super_symbol_01;
  StringPiece sub_symbol_00;
  StringPiece super_symbol_02;
  DescriptorIndex *pDVar4;
  size_type sVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  char *pcVar9;
  const_iterator __position;
  LogMessage *pLVar10;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var11;
  char *pcVar12;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_01;
  SymbolEntry *this_02;
  _Base_ptr p_Var13;
  StringPiece sub_symbol_01;
  StringPiece sub_symbol_02;
  _Alloc_node __an;
  string entry_as_string;
  SymbolEntry entry;
  LogFinisher local_f9;
  DescriptorIndex *local_f8;
  StringPiece local_f0;
  undefined1 local_e0 [56];
  string local_a8;
  SymbolEntry *local_88;
  char *local_80;
  string local_78;
  SymbolEntry local_58;
  
  pcVar12 = (char *)symbol.length_;
  local_58.data_offset =
       (int)((ulong)((long)(this->all_values_).
                           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->all_values_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
  local_e0._0_8_ =
       (set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
        *)symbol.ptr_;
  local_e0._8_8_ = pcVar12;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_
            (&local_58.encoded_symbol,(StringPiece *)local_e0);
  SymbolEntry::AsString_abi_cxx11_(&local_78,&local_58,this);
  if (pcVar12 != (char *)0x0) {
    pcVar9 = (char *)0x0;
    do {
      bVar2 = pcVar9[(long)&((set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                              *)symbol.ptr_)->_M_t];
      if ((((bVar2 != 0x2e) && (bVar2 != 0x5f)) && ((byte)(bVar2 - 0x3a) < 0xf6)) &&
         ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_e0,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2bf);
        pLVar10 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Invalid symbol name: ");
        pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_78);
        internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar10);
        goto LAB_0038406e;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar12 != pcVar9);
  }
  this_00 = &this->by_symbol_;
  p_Var13 = (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
  __position._M_node = &p_Var1->_M_header;
  if (p_Var13 != (_Base_ptr)0x0) {
    do {
      bVar8 = SymbolCompare::operator()
                        ((SymbolCompare *)this_00,&local_58,(SymbolEntry *)(p_Var13 + 1));
      if (bVar8) {
        __position._M_node = p_Var13;
      }
      p_Var13 = (&p_Var13->_M_left)[!bVar8];
    } while (p_Var13 != (_Base_ptr)0x0);
  }
  local_f8 = this;
  if (__position._M_node != (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
  {
    __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
  }
  sVar7 = local_78._M_string_length;
  _Var6._M_p = local_78._M_dataplus._M_p;
  if ((long)local_78._M_string_length < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              (local_78._M_string_length,"string length exceeds max size");
  }
  local_f0.ptr_ = _Var6._M_p;
  local_f0.length_ = sVar7;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
LAB_00383dc2:
    pDVar4 = local_f8;
    _Var11 = std::
             __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                       ((local_f8->by_symbol_flat_).
                        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (local_f8->by_symbol_flat_).
                        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&local_58,
                        (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                         )(local_f8->by_symbol_)._M_t._M_impl.
                          super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                          ._M_key_compare.index);
    _Var6._M_p = local_78._M_dataplus._M_p;
    this_01._M_current = _Var11._M_current + -1;
    if (_Var11._M_current ==
        (pDVar4->by_symbol_flat_).
        super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_01 = _Var11;
    }
    if ((long)local_78._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_78._M_string_length,"string length exceeds max size");
    }
    pSVar3 = (local_f8->by_symbol_flat_).
             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_f0.ptr_ = _Var6._M_p;
    local_f0.length_ = local_78._M_string_length;
    if (this_01._M_current != pSVar3) {
      SymbolEntry::AsString_abi_cxx11_((string *)local_e0,this_01._M_current,local_f8);
      sub_symbol_00.length_ = local_e0._8_8_;
      sub_symbol_00.ptr_ = (char *)local_e0._0_8_;
      if ((long)local_e0._8_8_ < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_e0._8_8_,"string length exceeds max size");
      }
      super_symbol_00.length_ = local_f0.length_;
      super_symbol_00.ptr_ = local_f0.ptr_;
      bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol_00,super_symbol_00);
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
      if (bVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_e0,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x29c);
        pLVar10 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Symbol name \"");
        pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_f0);
        pLVar10 = internal::LogMessage::operator<<
                            (pLVar10,"\" conflicts with the existing symbol \"");
        SymbolEntry::AsString_abi_cxx11_(&local_a8,this_01._M_current,local_f8);
        pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_a8);
        pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
        internal::LogFinisher::operator=(&local_f9,pLVar10);
        goto LAB_0038405b;
      }
      this_02 = this_01._M_current + 1;
      if (this_02 != pSVar3) {
        local_80 = local_f0.ptr_;
        local_88 = (SymbolEntry *)local_f0.length_;
        SymbolEntry::AsString_abi_cxx11_((string *)local_e0,this_02,local_f8);
        super_symbol_02.length_ = local_e0._8_8_;
        super_symbol_02.ptr_ = (char *)local_e0._0_8_;
        if ((long)local_e0._8_8_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (local_e0._8_8_,"string length exceeds max size");
        }
        sub_symbol_02.length_ = (size_type)local_88;
        sub_symbol_02.ptr_ = local_80;
        bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol_02,super_symbol_02);
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_);
        }
        if (bVar8) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_e0,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2aa);
          pLVar10 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Symbol name \"");
          pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_f0);
          pLVar10 = internal::LogMessage::operator<<
                              (pLVar10,"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_a8,this_02,local_f8);
          pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_a8);
          pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
          internal::LogFinisher::operator=(&local_f9,pLVar10);
          goto LAB_0038405b;
        }
      }
    }
    local_e0._0_8_ = this_00;
    std::
    _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
    ::
    _M_insert_unique_<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&,std::_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>::_Alloc_node>
              ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
                *)this_00,__position,&local_58,(_Alloc_node *)local_e0);
    bVar8 = true;
  }
  else {
    SymbolEntry::AsString_abi_cxx11_
              ((string *)local_e0,(SymbolEntry *)(__position._M_node + 1),local_f8);
    sub_symbol.length_ = local_e0._8_8_;
    sub_symbol.ptr_ = (char *)local_e0._0_8_;
    if ((long)local_e0._8_8_ < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_e0._8_8_,"string length exceeds max size");
    }
    super_symbol.length_ = local_f0.length_;
    super_symbol.ptr_ = local_f0.ptr_;
    bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol,super_symbol);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    if (!bVar8) {
      __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      sVar5 = local_f0.length_;
      if ((_Rb_tree_header *)__position._M_node != p_Var1) {
        local_80 = local_f0.ptr_;
        local_88 = (SymbolEntry *)(__position._M_node + 1);
        SymbolEntry::AsString_abi_cxx11_((string *)local_e0,local_88,local_f8);
        super_symbol_01.length_ = local_e0._8_8_;
        super_symbol_01.ptr_ = (char *)local_e0._0_8_;
        if ((long)local_e0._8_8_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (local_e0._8_8_,"string length exceeds max size");
        }
        sub_symbol_01.length_ = sVar5;
        sub_symbol_01.ptr_ = local_80;
        bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol_01,super_symbol_01);
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_);
        }
        if (bVar8) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_e0,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2aa);
          pLVar10 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Symbol name \"");
          pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_f0);
          pLVar10 = internal::LogMessage::operator<<
                              (pLVar10,"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_a8,local_88,local_f8);
          pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_a8);
          pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
          internal::LogFinisher::operator=(&local_f9,pLVar10);
          goto LAB_0038405b;
        }
      }
      goto LAB_00383dc2;
    }
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x29c);
    pLVar10 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Symbol name \"");
    pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_f0);
    pLVar10 = internal::LogMessage::operator<<(pLVar10,"\" conflicts with the existing symbol \"");
    SymbolEntry::AsString_abi_cxx11_(&local_a8,(SymbolEntry *)(__position._M_node + 1),local_f8);
    pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_a8);
    pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
    internal::LogFinisher::operator=(&local_f9,pLVar10);
LAB_0038405b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
LAB_0038406e:
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.encoded_symbol._M_dataplus._M_p != &local_58.encoded_symbol.field_2) {
    operator_delete(local_58.encoded_symbol._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    StringPiece symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}